

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_send_tree_connect(Curl_easy *data)

{
  connectdata *pcVar1;
  size_t sVar2;
  size_t sVar3;
  ulong maxlength;
  size_t byte_count;
  char *p;
  smb_conn *smbc;
  connectdata *conn;
  undefined1 uStack_41c;
  smb_tree_connect msg;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  msg.bytes._1016_8_ = data;
  sVar2 = strlen((pcVar1->host).name);
  sVar3 = strlen((char *)(pcVar1->proto).rtspc.buf.toobig);
  maxlength = sVar2 + sVar3 + 10;
  if (maxlength < 0x401) {
    memset((void *)((long)&conn + 5),0,0xb);
    conn._5_1_ = 4;
    conn._6_1_ = 0xff;
    _uStack_41c = 0;
    curl_msnprintf((char *)&msg.andx.offset,maxlength,"\\\\%s\\%s%c%s",(pcVar1->host).name,
                   (pcVar1->proto).ftpc.pp.sendsize,0,"?????");
    msg.andx._0_2_ = SUB82(maxlength,0);
    data_local._4_4_ =
         smb_send_message((Curl_easy *)msg.bytes._1016_8_,'u',(void *)((long)&conn + 5),
                          sVar2 + sVar3 + 0x15);
  }
  else {
    data_local._4_4_ = CURLE_FILESIZE_EXCEEDED;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode smb_send_tree_connect(struct Curl_easy *data)
{
  struct smb_tree_connect msg;
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  char *p = msg.bytes;

  const size_t byte_count = strlen(conn->host.name) + strlen(smbc->share) +
    strlen(SERVICENAME) + 5; /* 2 nulls and 3 backslashes */
  if(byte_count > sizeof(msg.bytes))
    return CURLE_FILESIZE_EXCEEDED;

  memset(&msg, 0, sizeof(msg) - sizeof(msg.bytes));
  msg.word_count = SMB_WC_TREE_CONNECT_ANDX;
  msg.andx.command = SMB_COM_NO_ANDX_COMMAND;
  msg.pw_len = 0;

  p += msnprintf(p, byte_count,
                 "\\\\%s\\"  /* hostname */
                 "%s%c"      /* share */
                 "%s",       /* service */
                 conn->host.name, smbc->share, 0, SERVICENAME);
  p++; /* count the final null termination */
  DEBUGASSERT(byte_count == (size_t)(p - msg.bytes));
  msg.byte_count = smb_swap16((unsigned short)byte_count);

  return smb_send_message(data, SMB_COM_TREE_CONNECT_ANDX, &msg,
                          sizeof(msg) - sizeof(msg.bytes) + byte_count);
}